

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

idx_t duckdb::TemplatedUpdateNumericStatistics<short>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  short sVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  idx_t iVar6;
  short sVar7;
  short sVar8;
  idx_t iVar9;
  idx_t iVar10;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = update->sel->sel_vector;
      sVar7 = *(short *)((long)&(stats->statistics).stats_union + 8);
      sVar8 = *(short *)((long)&(stats->statistics).stats_union + 0x18);
      iVar6 = 0;
      do {
        iVar9 = iVar6;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar6];
        }
        sVar1 = *(short *)(pdVar2 + iVar9 * 2);
        if (sVar1 <= sVar7) {
          sVar7 = sVar1;
        }
        if (sVar8 <= sVar1) {
          sVar8 = sVar1;
        }
        *(short *)((long)&(stats->statistics).stats_union + 8) = sVar7;
        *(short *)((long)&(stats->statistics).stats_union + 0x18) = sVar8;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar6 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      puVar3 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar4 = update->sel->sel_vector;
      psVar5 = sel->sel_vector;
      sVar7 = *(short *)((long)&(stats->statistics).stats_union + 8);
      sVar8 = *(short *)((long)&(stats->statistics).stats_union + 0x18);
      iVar9 = 0;
      iVar6 = 0;
      do {
        iVar10 = iVar9;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar9];
        }
        if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0))
        {
          psVar5[iVar6] = (sel_t)iVar9;
          iVar6 = iVar6 + 1;
          sVar1 = *(short *)(pdVar2 + iVar10 * 2);
          if (sVar1 <= sVar7) {
            sVar7 = sVar1;
          }
          *(short *)((long)&(stats->statistics).stats_union + 8) = sVar7;
          if (sVar8 <= sVar1) {
            sVar8 = sVar1;
          }
          *(short *)((long)&(stats->statistics).stats_union + 0x18) = sVar8;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  return iVar6;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}